

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
__thiscall
duckdb::StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
InitializeWriteState
          (StandardColumnWriter<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
           *this,RowGroup *row_group)

{
  pointer pCVar1;
  pointer pCVar2;
  ParquetWriter *writer;
  tuple<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
  this_00;
  pointer pSVar3;
  RowGroup *in_RDX;
  pointer *__ptr;
  templated_unique_single_t result;
  __uniq_ptr_impl<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
  local_38;
  
  pCVar1 = (in_RDX->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pCVar2 = (in_RDX->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  writer = (ParquetWriter *)
           (row_group->columns).
           super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
           super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00.
  super__Tuple_impl<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
  .
  super__Head_base<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_false>
  ._M_head_impl =
       (_Tuple_impl<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
        )operator_new(400);
  StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>::
  StandardColumnWriterState
            ((StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>
              *)this_00.
                super__Tuple_impl<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
                .
                super__Head_base<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_false>
                ._M_head_impl,writer,in_RDX,((long)pCVar1 - (long)pCVar2 >> 7) * -0x3333333333333333
            );
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
  .
  super__Head_base<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_false>
  ._M_head_impl =
       (tuple<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
        )(tuple<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
          )this_00.
           super__Tuple_impl<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
           .
           super__Head_base<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_false>
           ._M_head_impl;
  pSVar3 = unique_ptr<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>,_true>
           ::operator->((unique_ptr<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>,_true>
                         *)&local_38);
  pSVar3->encoding = RLE_DICTIONARY;
  PrimitiveColumnWriter::RegisterToRowGroup((PrimitiveColumnWriter *)row_group,in_RDX);
  (this->super_PrimitiveColumnWriter).super_ColumnWriter._vptr_ColumnWriter =
       (_func_int **)
       local_38._M_t.
       super__Tuple_impl<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_std::default_delete<duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_>_>
       .
       super__Head_base<0UL,_duckdb::StandardColumnWriterState<duckdb::string_t,_duckdb::string_t,_duckdb::ParquetBlobOperator>_*,_false>
       ._M_head_impl;
  return (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         (unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>)
         this;
}

Assistant:

unique_ptr<ColumnWriterState> InitializeWriteState(duckdb_parquet::RowGroup &row_group) override {
		auto result = make_uniq<StandardColumnWriterState<SRC, TGT, OP>>(writer, row_group, row_group.columns.size());
		result->encoding = duckdb_parquet::Encoding::RLE_DICTIONARY;
		RegisterToRowGroup(row_group);
		return std::move(result);
	}